

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

var __thiscall cs::function::call_rr(function *this,function *_this,vector *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Elt_pointer ppsVar2;
  statement_base *psVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined *puVar6;
  var *pvVar7;
  runtime_error *this_00;
  long *plVar8;
  size_type *psVar9;
  pointer paVar10;
  long lVar11;
  _Map_pointer pppsVar12;
  _Elt_pointer ppsVar13;
  ulong uVar14;
  _Elt_pointer ppsVar15;
  long lVar16;
  fcall_guard fcall;
  scope_guard scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [2];
  string local_70;
  string local_50;
  
  puVar6 = current_process;
  if ((*current_process & 1) != 0) {
    LOCK();
    *current_process = 0;
    UNLOCK();
    event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
  }
  if ((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 !=
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string
              (&local_50,
               (long)(_this->mArgs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(_this->mArgs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    std::operator+(local_b0,"Wrong size of arguments. Expected ",&local_50);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_b0);
    local_130._M_dataplus._M_p = (pointer)*plVar8;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_130._M_dataplus._M_p == psVar9) {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130.field_2._8_8_ = plVar8[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar9;
    }
    local_130._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::to_string
              (&local_70,
               (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 3);
    std::operator+(local_110,&local_130,&local_70);
    runtime_error::runtime_error(this_00,local_110);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_110[0]._M_dataplus._M_p = (pointer)_this;
  domain_manager::add_domain
            (&(((((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage);
  stack_type<cs_impl::any,std::allocator>::push<cs::pointer_const&>
            ((stack_type<cs_impl::any,std::allocator> *)(current_process + 0x80),
             (pointer *)&null_pointer);
  paVar10 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_finish != paVar10) {
    lVar11 = 0;
    lVar16 = 0;
    uVar14 = 0;
    do {
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(((((_this->mContext).
                      super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_runtime_type).storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((_this->mArgs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16),
                 (var *)((long)&paVar10->mDat + lVar11));
      uVar14 = uVar14 + 1;
      paVar10 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x20;
      lVar11 = lVar11 + 8;
    } while (uVar14 < (ulong)((long)(args->
                                    super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 3)
            );
  }
  ppsVar13 = (_this->mBody).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  ppsVar2 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar13 != ppsVar2) {
    ppsVar15 = (_this->mBody).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
    pppsVar12 = (_this->mBody).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      puVar6 = current_process;
      psVar3 = *ppsVar13;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
      }
      (*psVar3->_vptr_statement_base[3])(psVar3);
      peVar4 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (peVar4->return_fcall == true) {
        peVar4->return_fcall = false;
        pvVar7 = fcall_guard::get((fcall_guard *)&local_130);
        goto LAB_001d6738;
      }
      ppsVar13 = ppsVar13 + 1;
      if (ppsVar13 == ppsVar15) {
        ppsVar13 = pppsVar12[1];
        pppsVar12 = pppsVar12 + 1;
        ppsVar15 = ppsVar13 + 0x40;
      }
    } while (ppsVar13 != ppsVar2);
  }
  pvVar7 = fcall_guard::get((fcall_guard *)&local_130);
LAB_001d6738:
  peVar5 = (element_type *)pvVar7->mDat;
  if (peVar5 != (element_type *)0x0) {
    p_Var1 = &(peVar5->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    p_Var1->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1);
  }
  (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  stack_type<cs_impl::any,_std::allocator>::pop_no_return
            ((stack_type<cs_impl::any,_std::allocator> *)(current_process + 0x80));
  scope_guard::~scope_guard((scope_guard *)local_110);
  return (var)(proxy *)this;
}

Assistant:

var function::call_rr(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#else
		fcall_guard fcall;
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		for (auto &ptr: _this->mBody) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (_this->mContext->instance->return_fcall) {
				_this->mContext->instance->return_fcall = false;
				return fcall.get();
			}
		}
		return fcall.get();
	}